

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_avx2.c
# Opt level: O0

void av1_quantize_lp_avx2
               (int16_t *coeff_ptr,intptr_t n_coeffs,int16_t *round_ptr,int16_t *quant_ptr,
               int16_t *qcoeff_ptr,int16_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,
               int16_t *scan,int16_t *iscan)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i eob256_00;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int16_t iVar10;
  undefined1 (*in_RCX) [16];
  undefined1 (*in_RDX) [16];
  long in_RSI;
  undefined1 (*in_RDI) [32];
  undefined8 *in_R8;
  undefined8 *in_R9;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  undefined1 (*in_stack_00000008) [16];
  __m256i quant256;
  __m256i round256;
  __m256i eob256;
  __m256i nz_iscan;
  __m256i iscan_plus1;
  __m256i iscan_1;
  __m256i nz_mask;
  __m256i dqcoeff;
  __m256i qcoeff;
  __m256i abs_qcoeff;
  __m256i tmp_rnd;
  __m256i abs_coeff;
  __m256i coeff;
  __m256i nz_iscan_1;
  __m256i iscan_plus1_1;
  __m256i iscan_2;
  __m256i nz_mask_1;
  __m256i dqcoeff_1;
  __m256i qcoeff_1;
  __m256i abs_qcoeff_1;
  __m256i tmp_rnd_1;
  __m256i abs_coeff_1;
  __m256i coeff_1;
  int local_a44;
  longlong local_a40;
  undefined8 uStackY_a38;
  longlong lStackY_a30;
  undefined8 uVar11;
  longlong lVar12;
  undefined8 uVar13;
  longlong lVar14;
  undefined8 uStack_a08;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [3] [32];
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined1 (*local_7c0) [32];
  longlong *local_7b8;
  undefined1 *local_7b0;
  undefined1 *local_7a8;
  int16_t *local_790;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 (*local_608) [32];
  longlong *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  int16_t *local_5d8;
  long local_5d0;
  undefined1 local_5c0 [32];
  undefined1 (*local_5a0) [32];
  undefined1 (*local_598) [32];
  int16_t *local_590;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  longlong local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  longlong local_4c0;
  undefined8 uStack_4b8;
  longlong lStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  longlong local_480;
  undefined8 uStack_478;
  longlong lStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  longlong local_3c0;
  undefined8 uStack_3b8;
  longlong lStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  longlong local_380;
  undefined8 uStack_378;
  longlong lStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  ulong uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 *local_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 *local_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  local_980 = 0;
  uStack_978 = 0;
  uStack_970 = 0;
  uStack_968 = 0;
  local_9e0[0] = ZEXT1632(ZEXT816(0));
  local_930 = *(undefined8 *)*in_RDX;
  uStack_928 = *(undefined8 *)(*in_RDX + 8);
  local_a00._16_8_ = in_XMM2_Qa;
  local_a00._24_8_ = in_XMM2_Qb;
  local_a00._0_16_ = *in_RDX;
  local_940 = *(undefined8 *)*in_RCX;
  uStack_938 = *(undefined8 *)(*in_RCX + 8);
  local_950 = *(undefined8 *)*in_stack_00000008;
  uStack_948 = *(undefined8 *)(*in_stack_00000008 + 8);
  auVar1 = vpermq_avx2(local_a00,0x54);
  auVar2._16_8_ = in_XMM2_Qa;
  auVar2._0_16_ = *in_RCX;
  auVar2._24_8_ = in_XMM2_Qb;
  auVar2 = vpermq_avx2(auVar2,0x54);
  local_480 = auVar2._0_8_;
  uStack_478 = auVar2._8_8_;
  lStack_470 = auVar2._16_8_;
  uStack_a08 = auVar2._24_8_;
  auVar3._16_8_ = in_XMM2_Qa;
  auVar3._0_16_ = *in_stack_00000008;
  auVar3._24_8_ = in_XMM2_Qb;
  auVar3 = vpermq_avx2(auVar3,0x54);
  local_a40 = auVar3._0_8_;
  uStackY_a38 = auVar3._8_8_;
  lStackY_a30 = auVar3._16_8_;
  uStack_368 = auVar3._24_8_;
  local_790 = scan;
  local_7a8 = local_a00;
  local_7b0 = &stack0xfffffffffffff5e0;
  local_7b8 = &local_a40;
  local_7c0 = local_9e0;
  local_7e0 = *(undefined8 *)*in_RDI;
  uStack_7d8 = *(undefined8 *)(*in_RDI + 8);
  uStack_7d0 = *(undefined8 *)(*in_RDI + 0x10);
  uStack_7c8 = *(undefined8 *)(*in_RDI + 0x18);
  local_800 = vpabsw_avx2(*in_RDI);
  local_a00._0_8_ = auVar1._0_8_;
  uVar6 = local_a00._0_8_;
  local_500 = local_a00._0_8_;
  local_a00._8_8_ = auVar1._8_8_;
  uVar7 = local_a00._8_8_;
  uStack_4f8 = local_a00._8_8_;
  local_a00._16_8_ = auVar1._16_8_;
  uStack_4f0 = local_a00._16_8_;
  local_a00._24_8_ = auVar1._24_8_;
  uStack_4e8 = local_a00._24_8_;
  local_4e0 = local_800._0_8_;
  uStack_4d8 = local_800._8_8_;
  uStack_4d0 = local_800._16_8_;
  uStack_4c8 = local_800._24_8_;
  local_820 = vpaddsw_avx2(local_800,auVar1);
  uStack_468 = uStack_a08;
  local_460 = local_820._0_8_;
  uStack_458 = local_820._8_8_;
  uStack_450 = local_820._16_8_;
  uStack_448 = local_820._24_8_;
  local_840 = vpmulhw_avx2(local_820,auVar2);
  local_3e0 = local_840._0_8_;
  uStack_3d8 = local_840._8_8_;
  uStack_3d0 = local_840._16_8_;
  uStack_3c8 = local_840._24_8_;
  local_860 = vpsignw_avx2(local_840,*in_RDI);
  local_380 = local_a40;
  uStack_378 = uStackY_a38;
  lStack_370 = lStackY_a30;
  local_360 = local_860._0_8_;
  uStack_358 = local_860._8_8_;
  uStack_350 = local_860._16_8_;
  uStack_348 = local_860._24_8_;
  local_880 = vpmullw_avx2(local_860,auVar3);
  local_780 = 0;
  uStack_778 = 0;
  uStack_770 = 0;
  uStack_768 = 0;
  local_2e0 = local_840._0_8_;
  uStack_2d8 = local_840._8_8_;
  uStack_2d0 = local_840._16_8_;
  uStack_2c8 = local_840._24_8_;
  local_300 = 0;
  uStack_2f8 = 0;
  uStack_2f0 = 0;
  uStack_2e8 = 0;
  local_8a0 = vpcmpgtw_avx2(local_840,ZEXT1632(ZEXT816(0)));
  local_200 = local_860._0_8_;
  uStack_1f8 = local_860._8_8_;
  uStack_1f0 = local_860._16_8_;
  uStack_1e8 = local_860._24_8_;
  *in_R8 = local_860._0_8_;
  in_R8[1] = local_860._8_8_;
  in_R8[2] = local_860._16_8_;
  in_R8[3] = local_860._24_8_;
  local_240 = local_880._0_8_;
  uStack_238 = local_880._8_8_;
  uStack_230 = local_880._16_8_;
  uStack_228 = local_880._24_8_;
  *in_R9 = local_880._0_8_;
  in_R9[1] = local_880._8_8_;
  in_R9[2] = local_880._16_8_;
  in_R9[3] = local_880._24_8_;
  local_590 = scan;
  local_8c0 = *(undefined8 *)scan;
  uStack_8b8 = *(undefined8 *)(scan + 4);
  uStack_8b0 = *(undefined8 *)(scan + 8);
  uStack_8a8 = *(undefined8 *)(scan + 0xc);
  local_180 = local_8a0._0_8_;
  uStack_178 = local_8a0._8_8_;
  uStack_170 = local_8a0._16_8_;
  uStack_168 = local_8a0._24_8_;
  local_8e0 = vpsubw_avx2(*(undefined1 (*) [32])scan,local_8a0);
  local_e0 = local_8e0._0_8_;
  uStack_d8 = local_8e0._8_8_;
  uStack_d0 = local_8e0._16_8_;
  uStack_c8 = local_8e0._24_8_;
  local_100 = local_8a0._0_8_;
  uStack_f8 = local_8a0._8_8_;
  uStack_f0 = local_8a0._16_8_;
  uStack_e8 = local_8a0._24_8_;
  local_900 = vpand_avx2(local_8e0,local_8a0);
  local_60 = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  uStack_48 = 0;
  local_80 = local_900._0_8_;
  uStack_78 = local_900._8_8_;
  uStack_70 = local_900._16_8_;
  uStack_68 = local_900._24_8_;
  local_9e0[0] = vpmaxsw_avx2(local_9e0[0],local_900);
  uVar9 = local_9e0[0]._8_8_;
  uVar8 = local_9e0[0]._0_8_;
  uVar11 = uStack_368;
  lVar12 = local_480;
  uVar13 = uStack_478;
  lVar14 = lStack_470;
  local_a00 = auVar1;
  if (0x10 < in_RSI) {
    local_a00._0_16_ = local_9e0[0]._0_16_;
    local_a00._16_8_ = local_9e0[0]._0_8_;
    local_a00._24_8_ = local_9e0[0]._8_8_;
    for (local_a44 = 0x10; local_a40 = local_480, uStackY_a38 = uStack_478, lStackY_a30 = local_480,
        uVar11 = uStack_478, lVar12 = uVar6, uVar13 = uVar7, lVar14 = uVar6, local_a44 < in_RSI;
        local_a44 = local_a44 + 0x10) {
      local_5d0 = (long)local_a44;
      local_5d8 = scan;
      local_5f0 = local_a00;
      local_5f8 = &stack0xfffffffffffff5e0;
      local_600 = &local_a40;
      local_608 = local_9e0;
      local_598 = (undefined1 (*) [32])(*in_RDI + local_5d0 * 2);
      local_640 = *(undefined8 *)*local_598;
      uStack_638 = *(undefined8 *)(*local_598 + 8);
      uStack_630 = *(undefined8 *)(*local_598 + 0x10);
      uStack_628 = *(undefined8 *)(*local_598 + 0x18);
      local_660 = vpabsw_avx2(*local_598);
      local_540 = uVar8;
      uStack_538 = uVar9;
      uStack_530 = uVar8;
      uStack_528 = uVar9;
      local_520 = local_660._0_8_;
      uStack_518 = local_660._8_8_;
      uStack_510 = local_660._16_8_;
      uStack_508 = local_660._24_8_;
      local_680 = vpaddsw_avx2(local_660,local_a00);
      local_4c0 = uVar6;
      uStack_4b8 = uVar7;
      lStack_4b0 = uVar6;
      uStack_4a8 = uVar7;
      auVar5._16_8_ = uVar6;
      auVar5._0_16_ = auVar1._0_16_;
      auVar5._24_8_ = uVar7;
      local_4a0 = local_680._0_8_;
      uStack_498 = local_680._8_8_;
      uStack_490 = local_680._16_8_;
      uStack_488 = local_680._24_8_;
      local_6a0 = vpmulhw_avx2(local_680,auVar5);
      local_420 = local_6a0._0_8_;
      uStack_418 = local_6a0._8_8_;
      uStack_410 = local_6a0._16_8_;
      uStack_408 = local_6a0._24_8_;
      local_6c0 = vpsignw_avx2(local_6a0,*local_598);
      auVar4._16_8_ = local_480;
      auVar4._0_16_ = auVar2._0_16_;
      auVar4._24_8_ = uStack_478;
      local_3a0 = local_6c0._0_8_;
      uStack_398 = local_6c0._8_8_;
      uStack_390 = local_6c0._16_8_;
      uStack_388 = local_6c0._24_8_;
      local_6e0 = vpmullw_avx2(local_6c0,auVar4);
      local_5c0._8_8_ = SUB328(ZEXT832(0),4);
      local_320 = local_6a0._0_8_;
      uStack_318 = local_6a0._8_8_;
      uStack_310 = local_6a0._16_8_;
      uStack_308 = local_6a0._24_8_;
      local_340 = 0;
      uStack_338 = local_5c0._8_8_;
      uStack_330 = 0;
      uStack_328 = 0;
      local_700 = vpcmpgtw_avx2(local_6a0,ZEXT832((ulong)local_5c0._8_8_) << 0x40);
      local_248 = (undefined8 *)((long)in_R8 + local_5d0 * 2);
      local_280 = local_6c0._0_8_;
      uStack_278 = local_6c0._8_8_;
      uStack_270 = local_6c0._16_8_;
      uStack_268 = local_6c0._24_8_;
      *local_248 = local_6c0._0_8_;
      local_248[1] = local_6c0._8_8_;
      local_248[2] = local_6c0._16_8_;
      local_248[3] = local_6c0._24_8_;
      local_288 = (undefined8 *)((long)in_R9 + local_5d0 * 2);
      local_2c0 = local_6e0._0_8_;
      uStack_2b8 = local_6e0._8_8_;
      uStack_2b0 = local_6e0._16_8_;
      uStack_2a8 = local_6e0._24_8_;
      *local_288 = local_6e0._0_8_;
      local_288[1] = local_6e0._8_8_;
      local_288[2] = local_6e0._16_8_;
      local_288[3] = local_6e0._24_8_;
      local_5a0 = (undefined1 (*) [32])(scan + local_5d0);
      local_720 = *(undefined8 *)*local_5a0;
      uStack_718 = *(undefined8 *)(*local_5a0 + 8);
      uStack_710 = *(undefined8 *)(*local_5a0 + 0x10);
      uStack_708 = *(undefined8 *)(*local_5a0 + 0x18);
      local_1c0 = local_700._0_8_;
      uStack_1b8 = local_700._8_8_;
      uStack_1b0 = local_700._16_8_;
      uStack_1a8 = local_700._24_8_;
      local_740 = vpsubw_avx2(*local_5a0,local_700);
      local_120 = local_740._0_8_;
      uStack_118 = local_740._8_8_;
      uStack_110 = local_740._16_8_;
      uStack_108 = local_740._24_8_;
      local_140 = local_700._0_8_;
      uStack_138 = local_700._8_8_;
      uStack_130 = local_700._16_8_;
      uStack_128 = local_700._24_8_;
      local_760 = vpand_avx2(local_740,local_700);
      local_a0 = local_9e0[0]._0_8_;
      uStack_98 = local_9e0[0]._8_8_;
      uStack_90 = local_9e0[0]._16_8_;
      uStack_88 = local_9e0[0]._24_8_;
      local_c0 = local_760._0_8_;
      uStack_b8 = local_760._8_8_;
      uStack_b0 = local_760._16_8_;
      uStack_a8 = local_760._24_8_;
      local_9e0[0] = vpmaxsw_avx2(local_9e0[0],local_760);
      local_5c0 = ZEXT832(0) << 0x20;
      local_580 = local_640;
      uStack_578 = uStack_638;
      uStack_570 = uStack_630;
      uStack_568 = uStack_628;
      local_440 = local_640;
      uStack_438 = uStack_638;
      uStack_430 = uStack_630;
      uStack_428 = uStack_628;
      local_3c0 = local_480;
      uStack_3b8 = uStack_478;
      lStack_3b0 = local_480;
      uStack_3a8 = uStack_478;
      local_1a0 = local_720;
      uStack_198 = uStack_718;
      uStack_190 = uStack_710;
      uStack_188 = uStack_708;
    }
  }
  eob256_00[1] = lVar12;
  eob256_00[0] = uVar11;
  eob256_00[2] = uVar13;
  eob256_00[3] = lVar14;
  local_560 = local_7e0;
  uStack_558 = uStack_7d8;
  uStack_550 = uStack_7d0;
  uStack_548 = uStack_7c8;
  local_400 = local_7e0;
  uStack_3f8 = uStack_7d8;
  uStack_3f0 = uStack_7d0;
  uStack_3e8 = uStack_7c8;
  local_160 = local_8c0;
  uStack_158 = uStack_8b8;
  uStack_150 = uStack_8b0;
  uStack_148 = uStack_8a8;
  iVar10 = accumulate_eob256(eob256_00);
  *dequant_ptr = iVar10;
  return;
}

Assistant:

void av1_quantize_lp_avx2(const int16_t *coeff_ptr, intptr_t n_coeffs,
                          const int16_t *round_ptr, const int16_t *quant_ptr,
                          int16_t *qcoeff_ptr, int16_t *dqcoeff_ptr,
                          const int16_t *dequant_ptr, uint16_t *eob_ptr,
                          const int16_t *scan, const int16_t *iscan) {
  (void)scan;
  __m256i eob256 = _mm256_setzero_si256();

  // Setup global values.
  __m256i round256 =
      _mm256_castsi128_si256(_mm_load_si128((const __m128i *)round_ptr));
  __m256i quant256 =
      _mm256_castsi128_si256(_mm_load_si128((const __m128i *)quant_ptr));
  __m256i dequant256 =
      _mm256_castsi128_si256(_mm_load_si128((const __m128i *)dequant_ptr));

  // Populate upper AC values.
  round256 = _mm256_permute4x64_epi64(round256, 0x54);
  quant256 = _mm256_permute4x64_epi64(quant256, 0x54);
  dequant256 = _mm256_permute4x64_epi64(dequant256, 0x54);

  // Process DC and the first 15 AC coeffs.
  quantize_lp_16_first(coeff_ptr, iscan, qcoeff_ptr, dqcoeff_ptr, &round256,
                       &quant256, &dequant256, &eob256);

  if (n_coeffs > 16) {
    // Overwrite the DC constants with AC constants
    dequant256 = _mm256_permute2x128_si256(dequant256, dequant256, 0x31);
    quant256 = _mm256_permute2x128_si256(quant256, quant256, 0x31);
    round256 = _mm256_permute2x128_si256(round256, round256, 0x31);

    // AC only loop.
    for (int idx = 16; idx < n_coeffs; idx += 16) {
      quantize_lp_16(coeff_ptr, idx, iscan, qcoeff_ptr, dqcoeff_ptr, &round256,
                     &quant256, &dequant256, &eob256);
    }
  }

  *eob_ptr = accumulate_eob256(eob256);
}